

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall
ThreadData::ThreadData
          (ThreadData *this,ThreadFunc *func,string *name,pid_t *tid,CountDownLatch *latch)

{
  pointer in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  function<void_()> *in_stack_ffffffffffffffc8;
  function<void_()> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  
  __str = in_RDI;
  std::function<void_()>::function(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string(unaff_retaddr,__str);
  in_RDI[2]._M_dataplus._M_p = in_RCX;
  in_RDI[2]._M_string_length = in_R8;
  return;
}

Assistant:

ThreadData(const ThreadFunc& func, const string& name, pid_t* tid, CountDownLatch* latch)
            : func_(func), name_(name), tid_(tid), latch_(latch) { }